

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void MIR_gen_finish(MIR_context_t ctx)

{
  gen_ctx *__ptr;
  lr_ctx *plVar1;
  live_range_t_conflict __ptr_00;
  lr_bb_t_conflict __ptr_01;
  gen_ctx *pgVar2;
  VARR_MIR_reg_t *pVVar3;
  undefined8 *puVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  dead_var_t_conflict *ppdVar8;
  DLIST_dead_var_t *pDVar9;
  char *pcVar10;
  MIR_context_t unaff_RBX;
  MIR_item_t pMVar11;
  MIR_insn_t_conflict in_RSI;
  MIR_item_t_conflict called_func;
  ra_ctx *prVar12;
  ra_ctx *prVar13;
  ra_ctx *ctx_00;
  ra_ctx *unaff_R12;
  HTAB_def_tab_el_t *unaff_R13;
  MIR_item_t *ppMVar14;
  void *pvVar15;
  ra_ctx *unaff_R15;
  uint8_t *puVar16;
  bool bVar17;
  int iStack_74;
  MIR_item_t_conflict pMStack_70;
  ra_ctx *prStack_68;
  uint8_t *puStack_60;
  MIR_context_t pMStack_58;
  ra_ctx *prStack_50;
  HTAB_def_tab_el_t *pHStack_48;
  gen_ctx *pgStack_40;
  ra_ctx *prStack_38;
  
  __ptr = ctx->gen_ctx;
  ctx_00 = (ra_ctx *)ctx;
  if (__ptr != (gen_ctx *)0x0) {
    unaff_R12 = (ra_ctx *)__ptr->data_flow_ctx;
    unaff_R15 = *(ra_ctx **)unaff_R12;
    if ((unaff_R15 == (ra_ctx *)0x0) ||
       (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, unaff_RBX = ctx, ctx_00 == (ra_ctx *)0x0)) {
LAB_001544e5:
      MIR_gen_finish_cold_95();
      prVar13 = ctx_00;
      ctx_00 = unaff_R15;
LAB_001544ea:
      prVar12 = prVar13;
      MIR_gen_finish_cold_94();
LAB_001544ef:
      MIR_gen_finish_cold_93();
LAB_001544f4:
      prVar13 = prVar12;
      MIR_gen_finish_cold_92();
LAB_001544f9:
      MIR_gen_finish_cold_91();
LAB_001544fe:
      prVar12 = prVar13;
      MIR_gen_finish_cold_90();
LAB_00154503:
      MIR_gen_finish_cold_89();
LAB_00154508:
      prVar13 = prVar12;
      MIR_gen_finish_cold_88();
LAB_0015450d:
      MIR_gen_finish_cold_87();
LAB_00154512:
      MIR_gen_finish_cold_86();
LAB_00154517:
      prVar12 = prVar13;
      MIR_gen_finish_cold_85();
LAB_0015451c:
      MIR_gen_finish_cold_84();
LAB_00154521:
      MIR_gen_finish_cold_83();
LAB_00154526:
      prVar13 = prVar12;
      MIR_gen_finish_cold_82();
LAB_0015452b:
      MIR_gen_finish_cold_81();
LAB_00154530:
      MIR_gen_finish_cold_80();
LAB_00154535:
      prVar12 = prVar13;
      MIR_gen_finish_cold_79();
LAB_0015453a:
      MIR_gen_finish_cold_78();
LAB_0015453f:
      MIR_gen_finish_cold_77();
LAB_00154544:
      MIR_gen_finish_cold_76();
LAB_00154549:
      prVar13 = prVar12;
      MIR_gen_finish_cold_75();
LAB_0015454e:
      MIR_gen_finish_cold_74();
LAB_00154553:
      prVar12 = prVar13;
      MIR_gen_finish_cold_73();
LAB_00154558:
      MIR_gen_finish_cold_72();
LAB_0015455d:
      prVar13 = prVar12;
      MIR_gen_finish_cold_71();
LAB_00154562:
      MIR_gen_finish_cold_70();
LAB_00154567:
      prVar12 = prVar13;
      MIR_gen_finish_cold_69();
LAB_0015456c:
      MIR_gen_finish_cold_68();
LAB_00154571:
      prVar13 = prVar12;
      MIR_gen_finish_cold_67();
LAB_00154576:
      MIR_gen_finish_cold_66();
LAB_0015457b:
      prVar12 = prVar13;
      MIR_gen_finish_cold_65();
LAB_00154580:
      MIR_gen_finish_cold_64();
LAB_00154585:
      unaff_R15 = prVar12;
      MIR_gen_finish_cold_63();
    }
    else {
      free(ctx_00);
      free(unaff_R15);
      *(undefined8 *)unaff_R12 = 0;
      unaff_R12 = (ra_ctx *)__ptr->data_flow_ctx;
      prVar12 = (ra_ctx *)unaff_R12->reg_renumber;
      prVar13 = unaff_R15;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544ea;
      free(prVar13);
      free(prVar12);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      ctx_00 = (ra_ctx *)__ptr->data_flow_ctx->bb_to_consider;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544ef;
      free(prVar12);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->data_flow_ctx;
      free(prVar12);
      __ptr->data_flow_ctx = (data_flow_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar13 = *(ra_ctx **)unaff_R12;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544f4;
      free(prVar12);
      free(prVar13);
      *(undefined8 *)unaff_R12 = 0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544f9;
      free(prVar13);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar12 = (ra_ctx *)unaff_R12->sorted_regs;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544fe;
      free(prVar13);
      free(prVar12);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->used_locs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154503;
      free(prVar12);
      free(ctx_00);
      unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar12 = (ra_ctx *)unaff_R12->busy_used_locs;
      if ((VARR_MIR_proto_t *)prVar12->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)prVar12);
      }
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->busy_used_locs;
      prVar13 = (ra_ctx *)unaff_R13->els;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154508;
      free(prVar12);
      free(prVar13);
      unaff_R13->els = (VARR_HTAB_EL_def_tab_el_t *)0x0;
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->busy_used_locs;
      ctx_00 = (ra_ctx *)unaff_R13->entries;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015450d;
      free(prVar13);
      free(ctx_00);
      unaff_R13->entries = (VARR_htab_ind_t *)0x0;
      prVar13 = (ra_ctx *)unaff_R12->busy_used_locs;
      free(prVar13);
      unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154512;
      free(prVar13);
      free(ctx_00);
      unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar12 = (ra_ctx *)unaff_R12->spill_gaps;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154517;
      free(prVar13);
      free(prVar12);
      unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015451c;
      free(prVar12);
      free(ctx_00);
      unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->ssa_ctx;
      free(prVar12);
      __ptr->ssa_ctx = (ssa_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154521;
      free(prVar12);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      prVar12 = (ra_ctx *)unaff_R12->used_locs;
      if ((VARR_MIR_proto_t *)prVar12->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_expr_t_clear((HTAB_expr_t *)prVar12);
      }
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->used_locs;
      prVar13 = (ra_ctx *)unaff_R13->els;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154526;
      free(prVar12);
      free(prVar13);
      unaff_R13->els = (VARR_HTAB_EL_def_tab_el_t *)0x0;
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->used_locs;
      ctx_00 = (ra_ctx *)unaff_R13->entries;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015452b;
      free(prVar13);
      free(ctx_00);
      unaff_R13->entries = (VARR_htab_ind_t *)0x0;
      free((live_range_t_conflict)unaff_R12->used_locs);
      unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
      prVar13 = (ra_ctx *)__ptr->gvn_ctx->temp_mem_insn;
      free(prVar13);
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154530;
      free(prVar13);
      free(ctx_00);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      prVar13 = (ra_ctx *)unaff_R12->busy_used_locs;
      if ((VARR_MIR_proto_t *)prVar13->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_mem_expr_t_clear((HTAB_mem_expr_t *)prVar13);
      }
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->busy_used_locs;
      prVar12 = (ra_ctx *)unaff_R13->els;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154535;
      free(prVar13);
      free(prVar12);
      unaff_R13->els = (VARR_HTAB_EL_def_tab_el_t *)0x0;
      unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->busy_used_locs;
      ctx_00 = (ra_ctx *)unaff_R13->entries;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015453a;
      free(prVar12);
      free(ctx_00);
      unaff_R13->entries = (VARR_htab_ind_t *)0x0;
      prVar12 = (ra_ctx *)unaff_R12->busy_used_locs;
      free(prVar12);
      unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015453f;
      free(prVar12);
      free(ctx_00);
      unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->gvn_ctx;
      free(prVar12);
      __ptr->gvn_ctx = (gvn_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[3];
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154544;
      free(prVar12);
      free(ctx_00);
      unaff_R12->lr_gap_bitmaps[3] = (bitmap_t)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      prVar13 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[4];
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154549;
      free(prVar12);
      free(prVar13);
      unaff_R12->lr_gap_bitmaps[4] = (bitmap_t)0x0;
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->live_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015454e;
      free(prVar13);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->lr_ctx->referenced_vars;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154553;
      free(prVar13);
      free(prVar12);
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->points_with_born_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154558;
      free(prVar12);
      free(ctx_00);
      prVar13 = (ra_ctx *)__ptr->lr_ctx->points_with_dead_vars;
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015455d;
      free(prVar12);
      free(prVar13);
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->points_with_born_or_dead_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154562;
      free(prVar13);
      free(ctx_00);
      plVar1 = __ptr->lr_ctx;
      __ptr_00 = plVar1->free_lr_list;
      while (__ptr_00 != (live_range_t_conflict)0x0) {
        plVar1->free_lr_list = __ptr_00->next;
        free(__ptr_00);
        plVar1 = __ptr->lr_ctx;
        __ptr_00 = plVar1->free_lr_list;
      }
      plVar1 = __ptr->lr_ctx;
      __ptr_01 = plVar1->free_lr_bb_list;
      while (__ptr_01 != (lr_bb_t_conflict)0x0) {
        plVar1->free_lr_bb_list = __ptr_01->next;
        free(__ptr_01);
        plVar1 = __ptr->lr_ctx;
        __ptr_01 = plVar1->free_lr_bb_list;
      }
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      prVar12 = (ra_ctx *)unaff_R12->reg_renumber;
      prVar13 = (ra_ctx *)0x0;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154567;
      free(prVar13);
      free(prVar12);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015456c;
      free(prVar12);
      free(ctx_00);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->lr_ctx;
      free(prVar12);
      __ptr->lr_ctx = (lr_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      prVar13 = *(ra_ctx **)unaff_R12;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154571;
      free(prVar12);
      free(prVar13);
      *(undefined8 *)unaff_R12 = 0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154576;
      free(prVar13);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      prVar12 = (ra_ctx *)unaff_R12->sorted_regs;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015457b;
      free(prVar13);
      free(prVar12);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      ctx_00 = (ra_ctx *)__ptr->coalesce_ctx->conflict_matrix;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154580;
      free(prVar12);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->coalesce_ctx;
      free(prVar12);
      __ptr->coalesce_ctx = (coalesce_ctx *)0x0;
      unaff_R12 = __ptr->ra_ctx;
      unaff_R15 = (ra_ctx *)unaff_R12->reg_renumber;
      ctx_00 = unaff_R15;
      if ((unaff_R15 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)unaff_R15->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154585;
      free(prVar12);
      free(unaff_R15);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = __ptr->ra_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 != (ra_ctx *)0x0) &&
         (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 != (ra_ctx *)0x0)) {
        free(unaff_R15);
        free(ctx_00);
        unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
        while( true ) {
          unaff_R12 = __ptr->ra_ctx;
          unaff_R15 = (ra_ctx *)unaff_R12->used_locs;
          if (unaff_R15 == (ra_ctx *)0x0) break;
          pgVar2 = *(gen_ctx **)&unaff_R15->start_mem_loc;
          if (pgVar2 == (gen_ctx *)0x0) {
            ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
            if (ctx_00 == (ra_ctx *)0x0) goto LAB_0015466b;
            free(ctx_00);
            free(unaff_R15);
            unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
            ctx_00 = unaff_R15;
            goto LAB_0015391b;
          }
          if (unaff_R15->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544cc;
          *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar2[-1].spot_attrs + 7);
          unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar2 * 8 + -8);
          if ((unaff_R15 == (ra_ctx *)0x0) ||
             (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0))
          goto LAB_001544a4;
          free(ctx_00);
          free(unaff_R15);
          ctx_00 = unaff_R15;
        }
        goto LAB_001544bd;
      }
    }
    MIR_gen_finish_cold_62();
    ctx = unaff_RBX;
LAB_0015458f:
    MIR_gen_finish_cold_55();
LAB_00154594:
    prVar13 = unaff_R15;
    MIR_gen_finish_cold_54();
LAB_00154599:
    MIR_gen_finish_cold_53();
    goto LAB_0015459e;
  }
  goto LAB_00154666;
LAB_0015391b:
  unaff_R12 = __ptr->ra_ctx;
  unaff_R15 = (ra_ctx *)unaff_R12->busy_used_locs;
  if (unaff_R15 == (ra_ctx *)0x0) goto LAB_001544c2;
  pgVar2 = *(gen_ctx **)&unaff_R15->start_mem_loc;
  if (pgVar2 == (gen_ctx *)0x0) {
    ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
    if (ctx_00 == (ra_ctx *)0x0) goto LAB_00154670;
    free(ctx_00);
    free(unaff_R15);
    unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
    ctx_00 = unaff_R15;
    goto LAB_00153999;
  }
  if (unaff_R15->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544d1;
  *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar2[-1].spot_attrs + 7);
  unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar2 * 8 + -8);
  if ((unaff_R15 == (ra_ctx *)0x0) ||
     (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0)) goto LAB_001544a9;
  free(ctx_00);
  free(unaff_R15);
  ctx_00 = unaff_R15;
  goto LAB_0015391b;
LAB_00153999:
  unaff_R12 = __ptr->ra_ctx;
  unaff_R15 = (ra_ctx *)unaff_R12->var_bbs;
  if (unaff_R15 == (ra_ctx *)0x0) goto LAB_001544c7;
  pgVar2 = *(gen_ctx **)&unaff_R15->start_mem_loc;
  if (pgVar2 == (gen_ctx *)0x0) {
    ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
    if (ctx_00 == (ra_ctx *)0x0) goto LAB_00154675;
    free(ctx_00);
    free(unaff_R15);
    unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->spill_gaps;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_0015458f;
    free(unaff_R15);
    free(ctx_00);
    unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    prVar13 = (ra_ctx *)unaff_R12->curr_gaps;
    unaff_R15 = ctx_00;
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (unaff_R15 = (ra_ctx *)prVar13->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_00154594;
    free(unaff_R15);
    free(prVar13);
    unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->spill_els;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154599;
    free(prVar13);
    free(ctx_00);
    unaff_R12->spill_els = (VARR_spill_el_t *)0x0;
    unaff_R12 = (ra_ctx *)0x8;
    goto LAB_00153acb;
  }
  if (unaff_R15->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544db;
  *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar2[-1].spot_attrs + 7);
  unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar2 * 8 + -8);
  if ((unaff_R15 == (ra_ctx *)0x0) ||
     (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0)) goto LAB_001544ae;
  free(ctx_00);
  free(unaff_R15);
  ctx_00 = unaff_R15;
  goto LAB_00153999;
code_r0x00153d9c:
  free(ctx_00);
  free(unaff_R15);
  unaff_R12 = (ra_ctx *)((long)&unaff_R12->start_mem_loc + 1);
  ctx_00 = unaff_R15;
  if (unaff_R12 == (ra_ctx *)0x20) goto code_r0x00153db2;
  goto LAB_00153d82;
code_r0x00153db2:
  prVar13 = (ra_ctx *)__ptr->tied_regs;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (unaff_R15 = (ra_ctx *)prVar13->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_001545d0;
  free(unaff_R15);
  free(prVar13);
  ctx_00 = (ra_ctx *)__ptr->addr_regs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545d5;
  free(prVar13);
  free(ctx_00);
  prVar12 = (ra_ctx *)__ptr->insn_to_consider;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545da;
  free(prVar13);
  free(prVar12);
  ctx_00 = (ra_ctx *)__ptr->func_used_hard_regs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545df;
  free(prVar12);
  free(ctx_00);
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->used_locs;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545e4;
  free(prVar12);
  free(prVar13);
  unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545e9;
  free(prVar13);
  free(ctx_00);
  unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->ctx;
  in_RSI = __ptr->target_ctx->temp_jump;
  _MIR_free_insn((MIR_context_t)prVar13,in_RSI);
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar12 = (ra_ctx *)unaff_R12->spill_gaps;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545ee;
  free(prVar13);
  free(prVar12);
  unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->busy_used_locs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545f3;
  free(prVar12);
  free(ctx_00);
  unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->curr_gaps;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545f8;
  free(prVar12);
  free(prVar13);
  unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0];
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545fd;
  free(prVar13);
  free(ctx_00);
  unaff_R12->lr_gap_bitmaps[0] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar12 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[1];
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154602;
  free(prVar13);
  free(prVar12);
  unaff_R12->lr_gap_bitmaps[1] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[2];
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154607;
  free(prVar12);
  free(ctx_00);
  unaff_R12->lr_gap_bitmaps[2] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[3];
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015460c;
  free(prVar12);
  free(prVar13);
  unaff_R12->lr_gap_bitmaps[3] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[4];
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154611;
  free(prVar13);
  free(ctx_00);
  unaff_R12->lr_gap_bitmaps[4] = (bitmap_t)0x0;
  free(__ptr->target_ctx);
  __ptr->target_ctx = (target_ctx *)0x0;
  ctx_00 = (ra_ctx *)(__ptr->free_dead_vars).head;
  if (ctx_00 != (ra_ctx *)0x0) {
    unaff_R15 = (ra_ctx *)&__ptr->free_dead_vars;
    unaff_R12 = (ra_ctx *)&(__ptr->free_dead_vars).tail;
    do {
      pVVar3 = ctx_00->reg_renumber;
      pDVar9 = (DLIST_dead_var_t *)&pVVar3->varr;
      if (pVVar3 == (VARR_MIR_reg_t *)0x0) {
        pDVar9 = (DLIST_dead_var_t *)unaff_R15;
      }
      pDVar9->head = (dead_var_t_conflict)ctx_00->sorted_regs;
      if (ctx_00->sorted_regs == (VARR_allocno_info_t *)0x0) {
        ppdVar8 = (dead_var_t_conflict *)unaff_R12;
        if (*(ra_ctx **)unaff_R12 != ctx_00) goto LAB_001544e0;
      }
      else {
        ppdVar8 = (dead_var_t_conflict *)&ctx_00->sorted_regs->size;
      }
      *ppdVar8 = (dead_var_t_conflict)pVVar3;
      ctx_00->reg_renumber = (VARR_MIR_reg_t *)0x0;
      ctx_00->sorted_regs = (VARR_allocno_info_t *)0x0;
      free(ctx_00);
      ctx_00 = (ra_ctx *)((DLIST_dead_var_t *)unaff_R15)->head;
    } while (ctx_00 != (ra_ctx *)0x0);
  }
  prVar13 = (ra_ctx *)__ptr->data_flow_ctx;
  free(prVar13);
  prVar12 = (ra_ctx *)__ptr->temp_bitmap;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154616;
  free(prVar13);
  free(prVar12);
  ctx_00 = (ra_ctx *)__ptr->temp_bitmap2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015461b;
  free(prVar12);
  free(ctx_00);
  prVar13 = (ra_ctx *)__ptr->temp_bitmap3;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154620;
  free(prVar12);
  free(prVar13);
  ctx_00 = (ra_ctx *)__ptr->temp_ops;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154625;
  free(prVar13);
  free(ctx_00);
  __ptr->temp_ops = (VARR_MIR_op_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->temp_insns;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015462a;
  free(prVar13);
  free(prVar12);
  __ptr->temp_insns = (VARR_MIR_insn_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->temp_insns2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015462f;
  free(prVar12);
  free(ctx_00);
  __ptr->temp_insns2 = (VARR_MIR_insn_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->temp_bb_insns;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154634;
  free(prVar12);
  free(prVar13);
  __ptr->temp_bb_insns = (VARR_bb_insn_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->temp_bb_insns2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154639;
  free(prVar13);
  free(ctx_00);
  __ptr->temp_bb_insns2 = (VARR_bb_insn_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->loop_nodes;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015463e;
  free(prVar13);
  free(prVar12);
  __ptr->loop_nodes = (VARR_loop_node_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->queue_nodes;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154643;
  free(prVar12);
  free(ctx_00);
  __ptr->queue_nodes = (VARR_loop_node_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->loop_entries;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154648;
  free(prVar12);
  free(prVar13);
  __ptr->loop_entries = (VARR_loop_node_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->mem_attrs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015464d;
  free(prVar13);
  free(ctx_00);
  __ptr->mem_attrs = (VARR_mem_attr_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->target_succ_bb_versions;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154652;
  free(prVar13);
  free(prVar12);
  __ptr->target_succ_bb_versions = (VARR_target_bb_version_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->succ_bb_addrs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154657;
  free(prVar12);
  free(ctx_00);
  __ptr->succ_bb_addrs = (VARR_void_ptr_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->spot_attrs;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015465c;
  free(prVar12);
  free(prVar13);
  __ptr->spot_attrs = (VARR_spot_attr_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->spot2attr;
  unaff_R15 = ctx_00;
  if ((ctx_00 != (ra_ctx *)0x0) &&
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 != (ra_ctx *)0x0)) {
    free(prVar13);
    free(ctx_00);
    __ptr->spot2attr = (VARR_spot_attr_t *)0x0;
    while (unaff_R15 = (ra_ctx *)__ptr->to_free, unaff_R15 != (ra_ctx *)0x0) {
      pgVar2 = *(gen_ctx **)&unaff_R15->start_mem_loc;
      ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
      if (pgVar2 == (gen_ctx *)0x0) {
        if (ctx_00 != (ra_ctx *)0x0) {
          free(ctx_00);
          free(unaff_R15);
          __ptr->to_free = (VARR_void_ptr_t *)0x0;
          free(__ptr);
          ctx->gen_ctx = (gen_ctx *)0x0;
          return;
        }
        goto LAB_0015467a;
      }
      if (ctx_00 == (ra_ctx *)0x0) goto LAB_001544b8;
      *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar2[-1].spot_attrs + 7);
      ctx_00 = (ra_ctx *)ctx_00->lr_gap_bitmaps[(long)((long)&pgVar2[-1].spot2attr + 7)];
      free(ctx_00);
    }
LAB_001544b3:
    MIR_gen_finish_cold_11();
LAB_001544b8:
    MIR_gen_finish_cold_9();
LAB_001544bd:
    MIR_gen_finish_cold_61();
LAB_001544c2:
    MIR_gen_finish_cold_59();
LAB_001544c7:
    MIR_gen_finish_cold_57();
LAB_001544cc:
    MIR_gen_finish_cold_2();
LAB_001544d1:
    MIR_gen_finish_cold_4();
LAB_001544d6:
    MIR_gen_finish_cold_7();
LAB_001544db:
    MIR_gen_finish_cold_6();
LAB_001544e0:
    MIR_gen_finish_cold_8();
    goto LAB_001544e5;
  }
  goto LAB_00154661;
LAB_00153acb:
  do {
    unaff_R15 = (ra_ctx *)__ptr->ra_ctx->lr_gap_bitmaps[(long)&unaff_R12[-1].out_reloads[7].var];
    if (unaff_R15 != (ra_ctx *)0x0) {
      ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
      if (ctx_00 == (ra_ctx *)0x0) goto LAB_001544d6;
      free(ctx_00);
      free(unaff_R15);
    }
    unaff_R12 = (ra_ctx *)((long)&unaff_R12->start_mem_loc + 1);
  } while (unaff_R12 != (ra_ctx *)0x2a);
  unaff_R12 = __ptr->ra_ctx;
  prVar13 = (ra_ctx *)unaff_R12->lr_gap_tab;
  if ((VARR_MIR_proto_t *)prVar13->var_bbs != (VARR_MIR_proto_t *)0x0) {
    HTAB_lr_gap_t_clear((HTAB_lr_gap_t *)prVar13);
  }
  unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->lr_gap_tab;
  prVar12 = (ra_ctx *)unaff_R13->els;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) {
LAB_0015459e:
    prVar12 = prVar13;
    MIR_gen_finish_cold_52();
LAB_001545a3:
    MIR_gen_finish_cold_51();
LAB_001545a8:
    prVar13 = prVar12;
    MIR_gen_finish_cold_50();
LAB_001545ad:
    MIR_gen_finish_cold_49();
LAB_001545b2:
    prVar12 = prVar13;
    MIR_gen_finish_cold_48();
LAB_001545b7:
    MIR_gen_finish_cold_47();
LAB_001545bc:
    prVar13 = prVar12;
    MIR_gen_finish_cold_46();
LAB_001545c1:
    MIR_gen_finish_cold_45();
LAB_001545c6:
    unaff_R15 = prVar13;
    MIR_gen_finish_cold_44();
  }
  else {
    free(prVar13);
    free(prVar12);
    unaff_R13->els = (VARR_HTAB_EL_def_tab_el_t *)0x0;
    unaff_R13 = (HTAB_def_tab_el_t *)unaff_R12->lr_gap_tab;
    ctx_00 = (ra_ctx *)unaff_R13->entries;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545a3;
    free(prVar12);
    free(ctx_00);
    unaff_R13->entries = (VARR_htab_ind_t *)0x0;
    prVar12 = (ra_ctx *)unaff_R12->lr_gap_tab;
    free(prVar12);
    unaff_R12->lr_gap_tab = (HTAB_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    prVar13 = (ra_ctx *)unaff_R12->spill_cache;
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545a8;
    free(prVar12);
    free(prVar13);
    unaff_R12->spill_cache = (VARR_spill_cache_el_t *)0x0;
    ctx_00 = (ra_ctx *)__ptr->ra_ctx->conflict_locs1;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545ad;
    free(prVar13);
    free(ctx_00);
    prVar13 = __ptr->ra_ctx;
    free(prVar13);
    __ptr->ra_ctx = (ra_ctx *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    prVar12 = *(ra_ctx **)unaff_R12;
    ctx_00 = prVar12;
    if ((prVar12 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545b2;
    free(prVar13);
    free(prVar12);
    *(undefined8 *)unaff_R12 = 0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545b7;
    free(prVar12);
    free(ctx_00);
    unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    prVar13 = (ra_ctx *)unaff_R12->spill_gaps;
    prVar12 = ctx_00;
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001545bc;
    free(prVar12);
    free(prVar13);
    unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545c1;
    free(prVar13);
    free(ctx_00);
    unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    unaff_R15 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0];
    prVar13 = ctx_00;
    ctx_00 = unaff_R15;
    if ((unaff_R15 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)unaff_R15->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001545c6;
    free(prVar13);
    free(unaff_R15);
    unaff_R12->lr_gap_bitmaps[0] = (bitmap_t)0x0;
    ctx_00 = (ra_ctx *)__ptr->combine_ctx->vars_bitmap;
    if ((ctx_00 != (ra_ctx *)0x0) &&
       (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 != (ra_ctx *)0x0)) {
      free(unaff_R15);
      free(ctx_00);
      ctx_00 = (ra_ctx *)__ptr->combine_ctx;
      free(ctx_00);
      __ptr->combine_ctx = (combine_ctx *)0x0;
      unaff_R12 = (ra_ctx *)0xd;
LAB_00153d82:
      unaff_R15 = (ra_ctx *)
                  __ptr->call_used_hard_regs[(long)((long)&unaff_R12[-1].out_reloads[6].hreg + 3)];
      if ((unaff_R15 != (ra_ctx *)0x0) &&
         (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 != (ra_ctx *)0x0))
      goto code_r0x00153d9c;
      MIR_gen_finish_cold_42();
LAB_001544a4:
      MIR_gen_finish_cold_1();
LAB_001544a9:
      MIR_gen_finish_cold_3();
LAB_001544ae:
      MIR_gen_finish_cold_5();
      goto LAB_001544b3;
    }
  }
  MIR_gen_finish_cold_43();
LAB_001545d0:
  prVar13 = unaff_R15;
  MIR_gen_finish_cold_41();
LAB_001545d5:
  MIR_gen_finish_cold_40();
LAB_001545da:
  prVar12 = prVar13;
  MIR_gen_finish_cold_39();
LAB_001545df:
  MIR_gen_finish_cold_38();
LAB_001545e4:
  prVar13 = prVar12;
  MIR_gen_finish_cold_37();
LAB_001545e9:
  MIR_gen_finish_cold_36();
LAB_001545ee:
  prVar12 = prVar13;
  MIR_gen_finish_cold_35();
LAB_001545f3:
  MIR_gen_finish_cold_34();
LAB_001545f8:
  prVar13 = prVar12;
  MIR_gen_finish_cold_33();
LAB_001545fd:
  MIR_gen_finish_cold_32();
LAB_00154602:
  prVar12 = prVar13;
  MIR_gen_finish_cold_31();
LAB_00154607:
  MIR_gen_finish_cold_30();
LAB_0015460c:
  prVar13 = prVar12;
  MIR_gen_finish_cold_29();
LAB_00154611:
  MIR_gen_finish_cold_28();
LAB_00154616:
  prVar12 = prVar13;
  MIR_gen_finish_cold_27();
LAB_0015461b:
  MIR_gen_finish_cold_26();
LAB_00154620:
  prVar13 = prVar12;
  MIR_gen_finish_cold_25();
LAB_00154625:
  MIR_gen_finish_cold_24();
LAB_0015462a:
  prVar12 = prVar13;
  MIR_gen_finish_cold_23();
LAB_0015462f:
  MIR_gen_finish_cold_22();
LAB_00154634:
  prVar13 = prVar12;
  MIR_gen_finish_cold_21();
LAB_00154639:
  MIR_gen_finish_cold_20();
LAB_0015463e:
  prVar12 = prVar13;
  MIR_gen_finish_cold_19();
LAB_00154643:
  MIR_gen_finish_cold_18();
LAB_00154648:
  prVar13 = prVar12;
  MIR_gen_finish_cold_17();
LAB_0015464d:
  MIR_gen_finish_cold_16();
LAB_00154652:
  prVar12 = prVar13;
  MIR_gen_finish_cold_15();
LAB_00154657:
  MIR_gen_finish_cold_14();
LAB_0015465c:
  prVar13 = prVar12;
  MIR_gen_finish_cold_13();
  unaff_R15 = ctx_00;
LAB_00154661:
  MIR_gen_finish_cold_12();
  unaff_RBX = ctx;
  ctx_00 = prVar13;
LAB_00154666:
  ctx = unaff_RBX;
  MIR_gen_finish_cold_96();
LAB_0015466b:
  MIR_gen_finish_cold_60();
LAB_00154670:
  MIR_gen_finish_cold_58();
LAB_00154675:
  MIR_gen_finish_cold_56();
LAB_0015467a:
  MIR_gen_finish_cold_10();
  pMStack_58 = ctx;
  prStack_50 = unaff_R12;
  pHStack_48 = unaff_R13;
  pgStack_40 = __ptr;
  prStack_38 = unaff_R15;
  if (in_RSI != (MIR_insn_t_conflict)0x0) {
    generate_func_code((MIR_context_t)ctx_00,(MIR_item_t)in_RSI,1);
    return;
  }
  called_func = *(MIR_item_t_conflict *)&ctx_00->start_mem_loc;
  pMVar11 = called_func[4].item_link.next[1].item_link.next;
  if (pMVar11 != (MIR_item_t)0x0) {
    pvVar15 = pMVar11->data;
    if (pvVar15 != (void *)0x0) {
      ppMVar14 = (MIR_item_t *)&((pMVar11->item_link).prev)->module;
      pMStack_70 = called_func;
      prStack_68 = ctx_00;
      do {
        puVar4 = *(undefined8 **)((long)((MIR_item *)(ppMVar14 + -1))->data + 0x40);
        puStack_60 = (uint8_t *)puVar4[0xd];
        pMVar11 = *ppMVar14;
        iStack_74 = *(int *)((long)&pMVar11->data + 2);
        lVar7 = (long)iStack_74;
        if (*(uint8_t *)&pMVar11->data == '@') {
          puVar16 = (uint8_t *)((long)&pMVar11->data + lVar7 + 6);
          lVar7 = (long)puStack_60 - (long)((long)&pMVar11->data + 6);
          bVar17 = puVar16 == puStack_60;
          bVar5 = lVar7 + 0x80000000U >> 0x20 != 0;
          if (bVar5 || bVar17) {
            bVar6 = false;
            if (((called_func->item_link).next != (MIR_item_t)0x0) &&
               (bVar6 = false, 1 < (int)called_func->item_type)) {
              ctx_00 = _stderr;
              fprintf((FILE *)_stderr,
                      "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                      ,*puVar4,pMVar11,puVar16);
              bVar6 = false;
              called_func = pMStack_70;
            }
          }
          else {
            iStack_74 = (int)lVar7;
            ctx_00 = prStack_68;
            _MIR_change_code((MIR_context_t)prStack_68,(uint8_t *)((long)&pMVar11->data + 2),
                             (uint8_t *)&iStack_74,4);
            called_func = pMStack_70;
            bVar6 = true;
          }
          if (!bVar5 && !bVar17) goto LAB_001547ac;
        }
        else {
          if (*(uint8_t *)&pMVar11->data != 0xff) {
            __assert_fail("call_addr[0] == 0x40",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
          }
          puVar16 = *(uint8_t **)((long)&pMVar11->data + lVar7 + 6);
          if (puStack_60 != puVar16) {
            pMVar11 = (MIR_item_t)((long)&pMVar11->data + lVar7 + 6);
            ctx_00 = prStack_68;
            _MIR_change_code((MIR_context_t)prStack_68,(uint8_t *)pMVar11,(uint8_t *)&puStack_60,8);
            bVar6 = false;
            called_func = pMStack_70;
LAB_001547ac:
            if (((called_func->item_link).next != (MIR_item_t)0x0) &&
               (1 < (int)called_func->item_type)) {
              pcVar10 = "32";
              if (!bVar6) {
                pcVar10 = "64";
              }
              ctx_00 = _stderr;
              fprintf((FILE *)_stderr,
                      "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                      ,pcVar10,*puVar4,pMVar11,puVar16,puStack_60);
              called_func = pMStack_70;
            }
          }
        }
        ppMVar14 = ppMVar14 + 2;
        pvVar15 = (void *)((long)pvVar15 + -1);
      } while (pvVar15 != (void *)0x0);
      pMVar11 = called_func[4].item_link.next[1].item_link.next;
      if ((pMVar11 == (MIR_item_t)0x0) || ((pMVar11->item_link).prev == (MIR_item_t)0x0)) {
        MIR_set_gen_interface_cold_1();
        goto LAB_0015488b;
      }
      pMVar11->data = (void *)0x0;
    }
    return;
  }
LAB_0015488b:
  MIR_set_gen_interface_cold_2();
  if (called_func != (MIR_item_t_conflict)0x0) {
    pvVar15 = _MIR_get_wrapper((MIR_context_t)ctx_00,called_func,
                               generate_func_and_redirect_to_func_code);
    _MIR_redirect_thunk((MIR_context_t)ctx_00,called_func->addr,pvVar15);
    return;
  }
  return;
}

Assistant:

void MIR_gen_finish (MIR_context_t ctx) {
  gen_ctx_t *gen_ctx_ptr = gen_ctx_loc (ctx), gen_ctx = *gen_ctx_ptr;

  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_finish before MIR_gen_init -- good bye\n");
    exit (1);
  }
  finish_data_flow (gen_ctx);
  finish_ssa (gen_ctx);
  finish_gvn (gen_ctx);
  finish_live_ranges (gen_ctx);
  finish_coalesce (gen_ctx);
  finish_ra (gen_ctx);
  finish_combine (gen_ctx);
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++)
    bitmap_destroy (call_used_hard_regs[type]);
  bitmap_destroy (tied_regs);
  bitmap_destroy (addr_regs);
  bitmap_destroy (insn_to_consider);
  bitmap_destroy (func_used_hard_regs);
  target_finish (gen_ctx);
  finish_dead_vars (gen_ctx);
  free (gen_ctx->data_flow_ctx);
  bitmap_destroy (temp_bitmap);
  bitmap_destroy (temp_bitmap2);
  bitmap_destroy (temp_bitmap3);
  VARR_DESTROY (MIR_op_t, temp_ops);
  VARR_DESTROY (MIR_insn_t, temp_insns);
  VARR_DESTROY (MIR_insn_t, temp_insns2);
  VARR_DESTROY (bb_insn_t, temp_bb_insns);
  VARR_DESTROY (bb_insn_t, temp_bb_insns2);
  VARR_DESTROY (loop_node_t, loop_nodes);
  VARR_DESTROY (loop_node_t, queue_nodes);
  VARR_DESTROY (loop_node_t, loop_entries);
  VARR_DESTROY (mem_attr_t, mem_attrs);
  VARR_DESTROY (target_bb_version_t, target_succ_bb_versions);
  VARR_DESTROY (void_ptr_t, succ_bb_addrs);
  VARR_DESTROY (spot_attr_t, spot_attrs);
  VARR_DESTROY (spot_attr_t, spot2attr);
  while (VARR_LENGTH (void_ptr_t, to_free) != 0) free (VARR_POP (void_ptr_t, to_free));
  VARR_DESTROY (void_ptr_t, to_free);
  if (collect_bb_stat_p)
    fprintf (stderr, "Overall bbs num = %llu, generated bbs num = %llu\n", overall_bbs_num,
             overall_gen_bbs_num);
  free (gen_ctx);
  *gen_ctx_ptr = NULL;
}